

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

Path * __thiscall fs::Path::setExtension(Path *this,string *string)

{
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __rhs = &this->_extension;
  std::__cxx11::string::_M_assign((string *)__rhs);
  if (*(this->_extension)._M_dataplus._M_p != '.') {
    std::operator+(&local_38,'.',__rhs);
    std::__cxx11::string::operator=((string *)__rhs,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  updateFile(this);
  return this;
}

Assistant:

fs::Path& fs::Path::setExtension(std::string const& string)
{
  _extension = string;
  if (_extension[0] != '.')
    _extension = '.' + _extension;
  updateFile();
  return *this;
}